

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::manual_tags_placement
          (NavierStokesBase *this,TagBoxArray *tags,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *bf_lev)

{
  int *piVar1;
  pointer pIVar2;
  Amr *pAVar3;
  pointer pIVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  pointer pOVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  IntVect IVar22;
  Box result;
  IntVect hi;
  Box outflowBox;
  int local_d8 [3];
  Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> outFaces;
  IntVect low;
  
  outFaces.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
  super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outFaces.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
  super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outFaces.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
  super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getOutFlowFaces(this,&outFaces);
  if (outFaces.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
      super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      outFaces.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
      super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
      super__Vector_impl_data._M_start &&
      -1 < (long)outFaces.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                 super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)outFaces.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                 super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl
                 .super__Vector_impl_data._M_start) {
    for (lVar21 = 0;
        pOVar8 = outFaces.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                 super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl
                 .super__Vector_impl_data._M_start,
        lVar21 < (long)outFaces.
                       super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                       super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)outFaces.
                       super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                       super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2; lVar21 = lVar21 + 1) {
      uVar12 = (long)outFaces.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                     super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar21].val % 3;
      uVar18 = (this->super_AmrLevel).level;
      pIVar2 = (bf_lev->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      pIVar4 = pIVar2 + (int)uVar18;
      lVar20 = *(long *)(this->super_AmrLevel).geom.domain.smallend.vect;
      lVar5 = *(long *)((this->super_AmrLevel).geom.domain.smallend.vect + 2);
      lVar6 = *(long *)(this->super_AmrLevel).geom.domain.bigend.vect;
      uVar7 = *(undefined8 *)((this->super_AmrLevel).geom.domain.bigend.vect + 2);
      result.bigend.vect[1] = (int)((ulong)lVar6 >> 0x20);
      result.bigend.vect[2] = (int)uVar7;
      result.btype.itype = SUB84(uVar7,4);
      result.smallend.vect[2] = (int)lVar5;
      result.bigend.vect[0] = (int)((ulong)lVar5 >> 0x20);
      iVar17 = pIVar2[(int)uVar18].vect[0];
      result.smallend.vect[0] = (int)lVar20;
      if ((iVar17 == 1) && (pIVar2[(int)uVar18].vect[1] == 1)) {
        if (pIVar4->vect[2] != 1) goto LAB_0032c713;
      }
      else {
        if (iVar17 != 1) {
          if (iVar17 == 4) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 2;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
            }
          }
          else if (iVar17 == 2) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 1;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
            }
          }
          else if (result.smallend.vect[0] < 0) {
            result.smallend.vect[0] = ~(~result.smallend.vect[0] / iVar17);
          }
          else {
            result.smallend.vect[0] = result.smallend.vect[0] / iVar17;
          }
        }
LAB_0032c713:
        result.smallend.vect[1] = (int)((ulong)lVar20 >> 0x20);
        iVar17 = pIVar4->vect[1];
        if (iVar17 != 1) {
          if (iVar17 == 4) {
            if (lVar20 < 0) {
              result.smallend.vect[1] = result.smallend.vect[1] >> 2;
            }
            else {
              result.smallend.vect[1] = (uint)result.smallend.vect[1] >> 2;
            }
          }
          else if (iVar17 == 2) {
            if (lVar20 < 0) {
              result.smallend.vect[1] = result.smallend.vect[1] >> 1;
            }
            else {
              result.smallend.vect[1] = (uint)result.smallend.vect[1] >> 1;
            }
          }
          else if (lVar20 < 0) {
            result.smallend.vect[1] = ~(~result.smallend.vect[1] / iVar17);
          }
          else {
            result.smallend.vect[1] = result.smallend.vect[1] / iVar17;
          }
        }
        iVar17 = pIVar4->vect[2];
        if (iVar17 != 1) {
          if (iVar17 == 4) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 2;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
            }
          }
          else if (iVar17 == 2) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 1;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
            }
          }
          else if (result.smallend.vect[2] < 0) {
            result.smallend.vect[2] = ~(~result.smallend.vect[2] / iVar17);
          }
          else {
            result.smallend.vect[2] = result.smallend.vect[2] / iVar17;
          }
        }
        result.btype.itype = SUB84(uVar7,4);
        result.bigend.vect[2] = (int)uVar7;
        if (result.btype.itype == 0) {
          iVar17 = pIVar4->vect[0];
          uVar14 = result.bigend.vect[0];
          if (iVar17 != 1) {
            if (iVar17 == 4) {
              uVar14 = result.bigend.vect[0] >> 2;
              if (-1 < lVar5) {
                uVar14 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (iVar17 == 2) {
              uVar14 = result.bigend.vect[0] >> 1;
              if (-1 < lVar5) {
                uVar14 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar5 < 0) {
              uVar14 = ~(~result.bigend.vect[0] / iVar17);
            }
            else {
              uVar14 = result.bigend.vect[0] / iVar17;
            }
          }
          result.bigend.vect[0] = uVar14;
          iVar17 = pIVar4->vect[1];
          uVar14 = result.bigend.vect[1];
          if (iVar17 != 1) {
            if (iVar17 == 4) {
              uVar14 = result.bigend.vect[1] >> 2;
              if (-1 < lVar6) {
                uVar14 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (iVar17 == 2) {
              uVar14 = result.bigend.vect[1] >> 1;
              if (-1 < lVar6) {
                uVar14 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar6 < 0) {
              uVar14 = ~(~result.bigend.vect[1] / iVar17);
            }
            else {
              uVar14 = result.bigend.vect[1] / iVar17;
            }
          }
          result.bigend.vect[1] = uVar14;
          iVar17 = pIVar4->vect[2];
          uVar14 = result.bigend.vect[2];
          if (iVar17 != 1) {
            if (iVar17 == 4) {
              uVar14 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar14 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (iVar17 == 2) {
              uVar14 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar14 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar14 = ~(~result.bigend.vect[2] / iVar17);
            }
            else {
              uVar14 = result.bigend.vect[2] / iVar17;
            }
          }
        }
        else {
          low.vect[0] = 0;
          low.vect[1] = 0;
          low.vect[2] = 0;
          for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
            if (((result.btype.itype >> ((uint)lVar20 & 0x1f) & 1) != 0) &&
               (result.bigend.vect[lVar20] % pIVar4->vect[lVar20] != 0)) {
              low.vect[lVar20] = 1;
            }
          }
          iVar17 = pIVar4->vect[0];
          uVar14 = result.bigend.vect[0];
          if (iVar17 != 1) {
            if (iVar17 == 4) {
              uVar14 = result.bigend.vect[0] >> 2;
              if (-1 < lVar5) {
                uVar14 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (iVar17 == 2) {
              uVar14 = result.bigend.vect[0] >> 1;
              if (-1 < lVar5) {
                uVar14 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar5 < 0) {
              uVar14 = ~(~result.bigend.vect[0] / iVar17);
            }
            else {
              uVar14 = result.bigend.vect[0] / iVar17;
            }
          }
          iVar17 = pIVar4->vect[1];
          uVar19 = result.bigend.vect[1];
          if (iVar17 != 1) {
            if (iVar17 == 4) {
              uVar19 = result.bigend.vect[1] >> 2;
              if (-1 < lVar6) {
                uVar19 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (iVar17 == 2) {
              uVar19 = result.bigend.vect[1] >> 1;
              if (-1 < lVar6) {
                uVar19 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar6 < 0) {
              uVar19 = ~(~result.bigend.vect[1] / iVar17);
            }
            else {
              uVar19 = result.bigend.vect[1] / iVar17;
            }
          }
          iVar17 = pIVar4->vect[2];
          uVar10 = result.bigend.vect[2];
          if (iVar17 != 1) {
            if (iVar17 == 4) {
              uVar10 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar10 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (iVar17 == 2) {
              uVar10 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar10 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar10 = ~(~result.bigend.vect[2] / iVar17);
            }
            else {
              uVar10 = result.bigend.vect[2] / iVar17;
            }
          }
          result.bigend.vect[0] = uVar14 + low.vect[0];
          result.bigend.vect[1] = uVar19 + low.vect[1];
          uVar14 = uVar10 + low.vect[2];
        }
        result.bigend.vect[2] = uVar14;
        lVar20 = result.smallend.vect._0_8_;
      }
      result.smallend.vect._0_8_ = lVar20;
      iVar17 = (int)uVar12;
      if (do_refine_outflow == 0) {
        if (do_derefine_outflow != 0) {
          pAVar3 = (this->super_AmrLevel).parent;
          iVar11 = pIVar2->vect[iVar17];
          iVar15 = (Nbuf_outflow / iVar11 + 1) - (uint)(Nbuf_outflow % iVar11 == 0);
          iVar11 = iVar11 * iVar15;
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          for (lVar20 = 0; (ulong)uVar18 * 0xc - lVar20 != 0; lVar20 = lVar20 + 0xc) {
            pIVar4 = (pAVar3->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start;
            low.vect._0_8_ = *(undefined8 *)((long)pIVar4->vect + lVar20);
            low.vect[2] = *(int *)((long)pIVar4->vect + lVar20 + 8);
            iVar15 = iVar11 * low.vect[iVar17] +
                     (pAVar3->super_AmrCore).super_AmrMesh.super_AmrInfo.n_proper;
            iVar11 = *(int *)((long)(pIVar2->vect + iVar17) + lVar20 + 0xc);
            iVar15 = (iVar15 / iVar11 + 1) - (uint)(iVar15 % iVar11 == 0);
            iVar11 = iVar11 * iVar15;
          }
          if (0 < iVar15) {
            low.vect[2] = result.smallend.vect[2];
            low.vect[0] = result.smallend.vect[0];
            low.vect[1] = result.smallend.vect[1];
            hi.vect[2] = result.bigend.vect[2];
            hi.vect[0] = result.bigend.vect[0];
            hi.vect[1] = result.bigend.vect[1];
            uVar16 = (long)outFaces.
                           super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                           super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar21].val % 3;
            uVar13 = uVar16 & 0xffffffff;
            uVar18 = (uint)uVar16;
            if (outFaces.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
                super__Vector_impl_data._M_start[lVar21].val < 3) {
              uVar13 = (ulong)(int)uVar18;
              iVar11 = low.vect[uVar13] + -1;
            }
            else {
              IVar22 = amrex::Box::type(&result);
              local_d8[0] = IVar22.vect[0];
              local_d8[1] = IVar22.vect[1];
              local_d8[2] = IVar22.vect[2];
              iVar11 = (~local_d8[uVar13] & 1U) + hi.vect[uVar13];
            }
            low.vect[uVar13] = iVar11;
            hi.vect[uVar13] = iVar11;
            outflowBox.smallend.vect[0] = low.vect[0];
            outflowBox.smallend.vect[1] = low.vect[1];
            outflowBox.smallend.vect[2] = low.vect[2];
            outflowBox.bigend.vect[2] = hi.vect[2];
            outflowBox.bigend.vect[0] = hi.vect[0];
            outflowBox.bigend.vect[1] = hi.vect[1];
            outflowBox.btype.itype = result.btype.itype & ~(1 << (uVar18 & 0x1f));
            for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
              if ((uVar12 & 0xffffffff) != uVar16) {
                piVar1 = outflowBox.smallend.vect + uVar16;
                *piVar1 = *piVar1 + -1;
                piVar1 = outflowBox.bigend.vect + uVar16;
                *piVar1 = *piVar1 + 1;
              }
            }
            if (pOVar8[lVar21].val < 3) {
              piVar1 = outflowBox.bigend.vect + iVar17;
              *piVar1 = *piVar1 + iVar15;
            }
            else {
              piVar1 = outflowBox.smallend.vect + iVar17;
              *piVar1 = *piVar1 - iVar15;
            }
            amrex::BoxArray::BoxArray((BoxArray *)&low,&outflowBox,1);
            amrex::TagBoxArray::setVal(tags,(BoxArray *)&low,CLEAR);
            goto LAB_0032cc09;
          }
        }
      }
      else {
        iVar11 = outFaces.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                 super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar21].val;
        uVar12 = (long)iVar11 % 3 & 0xffffffff;
        low.vect[2] = result.smallend.vect[2];
        low.vect[0] = result.smallend.vect[0];
        low.vect[1] = result.smallend.vect[1];
        hi.vect[2] = result.bigend.vect[2];
        hi.vect[0] = result.bigend.vect[0];
        hi.vect[1] = result.bigend.vect[1];
        uVar18 = (uint)((long)iVar11 % 3);
        if (iVar11 < 3) {
          uVar12 = (ulong)(int)uVar18;
          iVar15 = low.vect[uVar12] + -1;
        }
        else {
          IVar22 = amrex::Box::type(&result);
          local_d8[0] = IVar22.vect[0];
          local_d8[1] = IVar22.vect[1];
          local_d8[2] = IVar22.vect[2];
          iVar15 = (~local_d8[uVar12] & 1U) + hi.vect[uVar12];
        }
        low.vect[uVar12] = iVar15;
        hi.vect[uVar12] = iVar15;
        iVar11 = (uint)(iVar11 < 3) * 2 + -1;
        outflowBox.smallend.vect[0] = low.vect[0];
        outflowBox.smallend.vect[1] = low.vect[1];
        outflowBox.smallend.vect[2] = low.vect[2];
        outflowBox.bigend.vect[2] = hi.vect[2];
        outflowBox.bigend.vect[0] = hi.vect[0];
        outflowBox.bigend.vect[1] = hi.vect[1];
        outflowBox.btype.itype = result.btype.itype & ~(1 << (uVar18 & 0x1f));
        piVar1 = outflowBox.smallend.vect + iVar17;
        *piVar1 = *piVar1 + iVar11;
        piVar1 = outflowBox.bigend.vect + iVar17;
        *piVar1 = *piVar1 + iVar11;
        bVar9 = amrex::TagBoxArray::hasTags(tags,&outflowBox);
        if (bVar9) {
          amrex::BoxArray::BoxArray((BoxArray *)&low,&outflowBox,1);
          amrex::TagBoxArray::setVal(tags,(BoxArray *)&low,SET);
LAB_0032cc09:
          amrex::BoxArray::~BoxArray((BoxArray *)&low);
        }
      }
    }
  }
  std::_Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>::~_Vector_base
            ((_Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)&outFaces);
  return;
}

Assistant:

void
NavierStokesBase::manual_tags_placement (TagBoxArray&    tags,
                                         const Vector<IntVect>& bf_lev)
{
    Vector<Orientation> outFaces;
    getOutFlowFaces(outFaces);
    if (outFaces.size()>0)
    {
        for (int i=0; i<outFaces.size(); ++i)
        {
            const Orientation& outFace = outFaces[i];
            const int oDir = outFace.coordDir();
            const Box& crse_domain = amrex::coarsen(geom.Domain(),bf_lev[level]);
            const int mult = (outFace.isLow() ? +1 : -1);
            if (do_refine_outflow)
            {
                //
                // Refine entire outflow boundary if new boxes within grid_tol
                // from outflow
                //
                const int grid_tol = 1;

                Box outflowBox = amrex::adjCell(crse_domain,outFace,grid_tol);

                outflowBox.shift(oDir,mult*grid_tol);

                //
                // Only refine if there are already tagged cells in the outflow
                // region
                //
                bool hasTags = tags.hasTags(outflowBox);
                if (hasTags)
                    tags.setVal(BoxArray(&outflowBox,1),TagBox::SET);
                }
            else if (do_derefine_outflow)
            {
                const int np = parent->nProper();
                //
                // Calculate the number of level 0 cells to be left uncovered
                // at the outflow.  The convoluted logic allows for the fact that
                // the number of uncovered cells must be a multiple of the level
                // blocking factor.  So, when calculating the number of coarse
                // cells below, we always round the division up.
                //
                int N_coarse_cells = Nbuf_outflow / bf_lev[0][oDir];
                if (Nbuf_outflow % bf_lev[0][oDir] != 0)
                    N_coarse_cells++;

                int N_level_cells = N_coarse_cells * bf_lev[0][oDir];

                //
                // Adjust this to get the number of cells to be left uncovered at
                // levels higher than 0
                //
                for (int j = 1; j <= level; ++j)
                {
                    /*** Calculate the minimum cells at this level ***/

                    const int rat = (parent->refRatio(j-1))[oDir];
                    N_level_cells = N_level_cells * rat + np;

                    /*** Calculate the required number of coarse cells ***/

                    N_coarse_cells = N_level_cells / bf_lev[j][oDir];
                    if (N_level_cells % bf_lev[j][oDir] != 0)
                        N_coarse_cells++;

                    /*** Calculate the corresponding number of level cells ***/

                    N_level_cells = N_coarse_cells * bf_lev[j][oDir];
                }
                //
                // Untag the cells near the outflow
                //
                if (N_coarse_cells > 0)
                {
                    //
                    // Generate box at the outflow and grow it in all directions
                    // other than the outflow.  This forces outflow cells in the
                    // ghostcells in directions other that oDir to be cleared.
                    //
                    Box outflowBox = amrex::adjCell(crse_domain, outFace, 1);
                    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                        if (dir != oDir) outflowBox.grow(dir, 1);
                    //
                    // Now, grow the box into the domain (opposite direction as
                    // outFace) the number of cells we need to clear.
                    //
                    if (outFace.isLow())
                        outflowBox.growHi(oDir, N_coarse_cells);
                    else
                        outflowBox.growLo(oDir, N_coarse_cells);

                    tags.setVal(BoxArray(&outflowBox,1),TagBox::CLEAR);
                }
            }
        }
    }
}